

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O2

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_13;
  int64_t eval_b_14;
  sockaddr_in addr;
  uv_buf_t local_558;
  sockaddr_in addr3;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  
  can_recverr = 1;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  req1.data = (void *)(long)iVar1;
  req2.data = (void *)0x0;
  if (req1.data == (void *)0x0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&addr2);
    req1.data = (void *)(long)iVar1;
    req2.data = (void *)0x0;
    if (req1.data == (void *)0x0) {
      iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,&addr3);
      req1.data = (void *)(long)iVar1;
      req2.data = (void *)0x0;
      if (req1.data == (void *)0x0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_timer_init(puVar2,&timer);
        req1.data = (void *)(long)iVar1;
        req2.data = (void *)0x0;
        if (req1.data == (void *)0x0) {
          iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
          req1.data = (void *)(long)iVar1;
          req2.data = (void *)0x0;
          if (req1.data == (void *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_udp_init(puVar2,&client);
            req1.data = (void *)(long)iVar1;
            req2.data = (void *)0x0;
            if (req1.data == (void *)0x0) {
              iVar1 = uv_udp_bind(&client,(sockaddr *)&addr2,0);
              req1.data = (void *)(long)iVar1;
              req2.data = (void *)0x0;
              if (req1.data == (void *)0x0) {
                iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
                req1.data = (void *)(long)iVar1;
                req2.data = (void *)0x0;
                if (req1.data == (void *)0x0) {
                  local_558 = uv_buf_init("PING",4);
                  iVar1 = uv_udp_send(&req1,&client,&local_558,1,(sockaddr *)&addr,send_cb);
                  eval_b_13 = (int64_t)iVar1;
                  req3.data = (void *)0x0;
                  req2.data = (void *)eval_b_13;
                  if ((void *)eval_b_13 == (void *)0x0) {
                    local_558 = uv_buf_init("PANG",4);
                    iVar1 = uv_udp_send(&req2,&client,&local_558,1,(sockaddr *)&addr,send_cb);
                    req3.data = (void *)(long)iVar1;
                    req4.data = (void *)0x0;
                    if (req3.data == (void *)0x0) {
                      puVar2 = uv_default_loop();
                      iVar1 = uv_udp_init(puVar2,&client2);
                      req3.data = (void *)(long)iVar1;
                      req4.data = (void *)0x0;
                      if (req3.data == (void *)0x0) {
                        iVar1 = uv_udp_bind(&client2,(sockaddr *)&addr3,0x20);
                        req3.data = (void *)(long)iVar1;
                        req4.data = (void *)0x0;
                        if (req3.data == (void *)0x0) {
                          iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
                          req3.data = (void *)(long)iVar1;
                          req4.data = (void *)0x0;
                          if (req3.data == (void *)0x0) {
                            local_558 = uv_buf_init("PING",4);
                            iVar1 = uv_udp_send(&req3,&client2,&local_558,1,(sockaddr *)&addr,
                                                send_cb_recverr);
                            req4.data = (void *)(long)iVar1;
                            if (req4.data == (void *)0x0) {
                              local_558 = uv_buf_init("PANG",4);
                              iVar1 = uv_udp_send(&req4,&client2,&local_558,1,(sockaddr *)&addr,
                                                  send_cb_recverr);
                              eval_b_13 = (int64_t)iVar1;
                              eval_b_14 = 0;
                              if ((void *)eval_b_13 == (void *)0x0) {
                                puVar2 = uv_default_loop();
                                uv_run(puVar2,UV_RUN_DEFAULT);
                                eval_b_13 = (int64_t)send_cb_called;
                                eval_b_14 = 4;
                                if ((void *)eval_b_13 == (void *)0x4) {
                                  eval_b_13 = (int64_t)recv_cb_called;
                                  eval_b_14 = (int64_t)alloc_cb_called;
                                  if (eval_b_13 == eval_b_14) {
                                    eval_b_13 = 1;
                                    eval_b_14 = (int64_t)timer_cb_called;
                                    if ((void *)eval_b_14 == (void *)0x1) {
                                      eval_b_13 = (int64_t)close_cb_called;
                                      eval_b_14 = 3;
                                      if ((void *)eval_b_13 == (void *)0x3) {
                                        puVar2 = uv_default_loop();
                                        uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                        uv_run(puVar2,UV_RUN_DEFAULT);
                                        eval_b_13 = 0;
                                        puVar2 = uv_default_loop();
                                        iVar1 = uv_loop_close(puVar2);
                                        eval_b_14 = (int64_t)iVar1;
                                        if ((void *)eval_b_14 == (void *)0x0) {
                                          uv_library_shutdown();
                                          return 0;
                                        }
                                        pcVar5 = "uv_loop_close(uv_default_loop())";
                                        pcVar4 = "0";
                                        uVar3 = 199;
                                      }
                                      else {
                                        pcVar5 = "(long)(can_recverr ? 3 : 2)";
                                        pcVar4 = "close_cb_called";
                                        uVar3 = 0xc5;
                                      }
                                    }
                                    else {
                                      pcVar5 = "timer_cb_called";
                                      pcVar4 = "1";
                                      uVar3 = 0xc4;
                                    }
                                  }
                                  else {
                                    pcVar5 = "alloc_cb_called";
                                    pcVar4 = "recv_cb_called";
                                    uVar3 = 0xc3;
                                  }
                                }
                                else {
                                  pcVar5 = "(long)(can_recverr ? 4 : 2)";
                                  pcVar4 = "send_cb_called";
                                  uVar3 = 0xc2;
                                }
                              }
                              else {
                                pcVar5 = "0";
                                pcVar4 = "r";
                                uVar3 = 0xbd;
                              }
                            }
                            else {
                              pcVar5 = "0";
                              pcVar4 = "r";
                              uVar3 = 0xb3;
                              eval_b_14 = 0;
                              eval_b_13 = (int64_t)req4.data;
                            }
                            goto LAB_001ab6ce;
                          }
                          uVar3 = 0xa8;
                        }
                        else {
                          uVar3 = 0xa5;
                        }
                      }
                      else {
                        uVar3 = 0xa0;
                      }
                    }
                    else {
                      uVar3 = 0x9c;
                    }
                    req4.data = (void *)0x0;
                    pcVar5 = "0";
                    pcVar4 = "r";
                    eval_b_14 = 0;
                    eval_b_13 = (int64_t)req3.data;
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "r";
                    uVar3 = 0x92;
                    eval_b_14 = 0;
                  }
                  goto LAB_001ab6ce;
                }
                pcVar4 = "r";
                uVar3 = 0x87;
              }
              else {
                pcVar4 = "r";
                uVar3 = 0x84;
              }
            }
            else {
              pcVar4 = "r";
              uVar3 = 0x81;
            }
          }
          else {
            pcVar4 = "r";
            uVar3 = 0x7e;
          }
        }
        else {
          pcVar4 = "r";
          uVar3 = 0x7b;
        }
      }
      else {
        pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9125, &addr3)";
        uVar3 = 0x78;
      }
    }
    else {
      pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9124, &addr2)";
      uVar3 = 0x77;
    }
  }
  else {
    pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar3 = 0x76;
  }
  req2.data = (void *)0x0;
  pcVar5 = "0";
  eval_b_14 = 0;
  eval_b_13 = (int64_t)req1.data;
LAB_001ab6ce:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-unreachable.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b_13,"==",eval_b_14);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_OK(r);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_OK(r);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_OK(r);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_OK(r);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_OK(r);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_OK(r);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_OK(r);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}